

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void * raviX_ptrlist_iter_next(PtrListIterator *self)

{
  PtrList *pPVar1;
  int iVar2;
  uint uVar3;
  
  if (self->__head == (PtrList *)0x0) {
    return (void *)0x0;
  }
  iVar2 = self->__nr + 1;
  self->__nr = iVar2;
  pPVar1 = self->__list;
  while( true ) {
    uVar3 = *(uint *)pPVar1;
    if ((char)uVar3 <= iVar2) {
      do {
        pPVar1 = pPVar1->next_;
        if (pPVar1 == self->__head) {
          return (void *)0x0;
        }
        self->__list = pPVar1;
        self->__nr = 0;
        uVar3 = (uint)*(ushort *)pPVar1;
      } while ((char)*(ushort *)pPVar1 < '\x01');
      iVar2 = 0;
    }
    if (pPVar1->list_[iVar2] != (void *)0x0 || (uVar3 & 0xffff) < 0x100) break;
    iVar2 = iVar2 + 1;
    self->__nr = iVar2;
  }
  return pPVar1->list_[iVar2];
}

Assistant:

void *raviX_ptrlist_iter_next(PtrListIterator *self)
{
	if (self->__head == NULL)
		return NULL;
	self->__nr++;
Lretry:
	if (self->__nr < self->__list->nr_) {
		void *ptr = self->__list->list_[self->__nr];
		if (self->__list->rm_ && !ptr) {
			self->__nr++;
			goto Lretry;
		}
		return ptr;
	} else if (self->__list->next_ != self->__head) {
		self->__list = self->__list->next_;
		self->__nr = 0;
		goto Lretry;
	}
	return NULL;
}